

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReverseLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint32 uVar1;
  bool bVar2;
  ReverseLayerParams *pRVar3;
  Type *pTVar4;
  string err;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,1);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar2 = Result::good(&r);
  if (bVar2) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  pRVar3 = Specification::NeuralNetworkLayer::reverse(layer);
  if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
    uVar1 = (pRVar3->reversedim_).current_size_;
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
    if (uVar1 != pTVar4->rank_) {
      std::operator+(&local_40,"Invalid size of reverse_dim for \'",(layer->name_).ptr_);
      std::operator+(&err,&local_40,"\' layer.");
      std::__cxx11::string::~string((string *)&local_40);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
      std::__cxx11::string::~string((string *)&err);
      goto LAB_0059aa49;
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_0059aa49:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReverseLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.reverse();
    // requires len(reverseDim) == rank(inputTensor)
    if (layer.inputtensor_size() > 0) {
        if (params.reversedim_size() != static_cast<int>(layer.inputtensor(0).rank())) {
            const std::string err = "Invalid size of reverse_dim for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}